

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O3

void __thiscall glslang::TLiveTraverser::pushGlobalReference(TLiveTraverser *this,TString *name)

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  _List_node_base *p_Var5;
  long lVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  _List_node_base *p_Var8;
  ulong uVar9;
  ulong uVar10;
  
  iVar3 = (*this->intermediate->treeRoot->_vptr_TIntermNode[6])();
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 400))
                    ((long *)CONCAT44(extraout_var,iVar3));
  lVar6 = *(long *)(lVar4 + 8);
  if (*(long *)(lVar4 + 0x10) != lVar6) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      p_Var5 = (_List_node_base *)(**(code **)(**(long **)(lVar6 + uVar9 * 8) + 0x30))();
      if (((p_Var5 != (_List_node_base *)0x0) && (*(int *)&p_Var5[0xb]._M_prev == 1)) &&
         (lVar6 = (*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5),
         *(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8) == 8)) {
        lVar6 = (*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
        lVar6 = (**(code **)(*(long *)**(undefined8 **)(lVar6 + 8) + 0x40))();
        if (lVar6 != 0) {
          lVar6 = (*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
          plVar7 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar6 + 8) + 0x40))();
          plVar7 = (long *)(**(code **)(*plVar7 + 400))(plVar7);
          plVar7 = (long *)(**(code **)(*plVar7 + 0x60))(plVar7);
          if ((plVar7 != (long *)0x0) &&
             (lVar6 = (**(code **)(*plVar7 + 0x108))(plVar7), (*(uint *)(lVar6 + 8) & 0x7f) == 1)) {
            this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*plVar7 + 400))(plVar7);
            iVar3 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(this_00,name);
            if (iVar3 == 0) {
              p_Var8 = (_List_node_base *)operator_new(0x18);
              p_Var8[1]._M_next = p_Var5;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              psVar1 = &(this->destinations).
                        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
              return;
            }
          }
        }
      }
      lVar6 = *(long *)(lVar4 + 8);
      bVar2 = uVar10 < (ulong)(*(long *)(lVar4 + 0x10) - lVar6 >> 3);
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void pushGlobalReference(const TString& name)
    {
        TIntermSequence& globals = intermediate.getTreeRoot()->getAsAggregate()->getSequence();
        for (unsigned int f = 0; f < globals.size(); ++f) {
            TIntermAggregate* candidate = globals[f]->getAsAggregate();
            if (candidate && candidate->getOp() == EOpSequence &&
                candidate->getSequence().size() == 1 &&
                candidate->getSequence()[0]->getAsBinaryNode()) {
                TIntermBinary* binary = candidate->getSequence()[0]->getAsBinaryNode();
                TIntermSymbol* symbol = binary->getLeft()->getAsSymbolNode();
                if (symbol && symbol->getQualifier().storage == EvqGlobal &&
                    symbol->getName() == name) {
                    destinations.push_back(candidate);
                    break;
                }
            }
        }
    }